

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O1

RK_S32 __thiscall mpp_list::add_at_head(mpp_list *this,void *data,RK_S32 size)

{
  mpp_list_node *pmVar1;
  mpp_list_node *pmVar2;
  mpp_list_node *pmVar3;
  RK_S32 RVar4;
  
  if (this->head == (mpp_list_node *)0x0) {
    RVar4 = -0x16;
  }
  else {
    RVar4 = 0;
    pmVar3 = create_list(data,size,0);
    if (pmVar3 == (mpp_list_node *)0x0) {
      RVar4 = -0xc;
    }
    else {
      pmVar1 = this->head;
      pmVar2 = pmVar1->next;
      pmVar2->prev = pmVar3;
      pmVar3->next = pmVar2;
      pmVar3->prev = pmVar1;
      pmVar1->next = pmVar3;
      this->count = this->count + 1;
    }
  }
  return RVar4;
}

Assistant:

RK_S32 mpp_list::add_at_head(void *data, RK_S32 size)
{
    RK_S32 ret = -EINVAL;
    if (head) {
        mpp_list_node *node = create_list(data, size, 0);
        if (node) {
            mpp_list_add(node, head);
            count++;
            ret = 0;
        } else {
            ret = -ENOMEM;
        }
    }
    return ret;
}